

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegd_parser.c
# Opt level: O0

MPP_RET jpegd_parse(void *ctx,HalDecTask *task)

{
  MPP_RET MVar1;
  MPP_RET MVar2;
  void *pvVar3;
  JpegdCtx *JpegCtx;
  MPP_RET ret;
  HalDecTask *task_local;
  void *ctx_local;
  
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"jpegd_parser","enter\n","jpegd_parse");
  }
  task->valid = 0;
  pvVar3 = mpp_packet_get_data(*(MppPacket *)((long)ctx + 0x28));
  *(void **)((long)ctx + 0x50) = pvVar3;
  memset(*(void **)((long)ctx + 0x68),0,0x930);
  MVar1 = jpegd_decode_frame((JpegdCtx *)ctx);
  if (MVar1 == MPP_OK) {
    MVar2 = jpegd_allocate_frame((JpegdCtx *)ctx);
    if (MVar2 != MPP_OK) {
      return MPP_ERR_VALUE;
    }
    (task->syntax).data = *(void **)((long)ctx + 0x68);
    (task->syntax).number = 0x930;
    task->output = *(RK_S32 *)((long)ctx + 0x10);
    task->valid = 1;
    jpegd_update_frame((JpegdCtx *)ctx);
  }
  else {
    (task->flags).val = (task->flags).val & 0xfffffffffffffffb | 4;
  }
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"jpegd_parser","exit\n","jpegd_parse");
  }
  return MVar1;
}

Assistant:

static MPP_RET jpegd_parse(void *ctx, HalDecTask *task)
{
    jpegd_dbg_func("enter\n");
    MPP_RET ret = MPP_OK;
    JpegdCtx *JpegCtx = (JpegdCtx *)ctx;
    task->valid = 0;

    JpegCtx->buffer = (RK_U8 *)mpp_packet_get_data(JpegCtx->input_packet);

    memset(JpegCtx->syntax, 0, sizeof(JpegdSyntax));

    ret = jpegd_decode_frame(JpegCtx);
    if (MPP_OK == ret) {
        if (jpegd_allocate_frame(JpegCtx))
            return MPP_ERR_VALUE;

        task->syntax.data = (void *)JpegCtx->syntax;
        task->syntax.number = sizeof(JpegdSyntax);
        task->output = JpegCtx->frame_slot_index;
        task->valid = 1;

        jpegd_update_frame(JpegCtx);
    } else
        task->flags.parse_err = 1;

    jpegd_dbg_func("exit\n");
    return ret;
}